

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

void __thiscall duckdb::ART::Vacuum(ART *this,IndexLock *state)

{
  type paVar1;
  long lVar2;
  unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  indexes;
  _Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_48;
  
  if (*(char *)((long)&(this->tree).super_IndexPointer.data + 7) == '\0') {
    paVar1 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&this->allocators);
    lVar2 = 0;
    do {
      FixedSizeAllocator::Reset
                (*(FixedSizeAllocator **)
                  ((long)&paVar1->_M_elems[0].
                          super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                          .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> + lVar2));
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x48);
  }
  else {
    local_48._M_buckets = &local_48._M_single_bucket;
    local_48._M_bucket_count = 1;
    local_48._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_48._M_element_count = 0;
    local_48._M_rehash_policy._M_max_load_factor = 1.0;
    local_48._M_rehash_policy._M_next_resize = 0;
    local_48._M_single_bucket = (__node_base_ptr)0x0;
    InitializeVacuum(this,(unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
                           *)&local_48);
    if (local_48._M_element_count != 0) {
      Node::Vacuum(&this->tree,this,
                   (unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
                    *)&local_48);
      FinalizeVacuum(this,(unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
                           *)&local_48);
    }
    ::std::
    _Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_48);
  }
  return;
}

Assistant:

void ART::Vacuum(IndexLock &state) {
	D_ASSERT(owns_data);

	if (!tree.HasMetadata()) {
		for (auto &allocator : *allocators) {
			allocator->Reset();
		}
		return;
	}

	// True, if an allocator needs a vacuum, false otherwise.
	unordered_set<uint8_t> indexes;
	InitializeVacuum(indexes);

	// Skip vacuum, if no allocators require it.
	if (indexes.empty()) {
		return;
	}

	// Traverse the allocated memory of the tree to perform a vacuum.
	tree.Vacuum(*this, indexes);

	// Finalize the vacuum operation.
	FinalizeVacuum(indexes);
}